

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.hpp
# Opt level: O0

bool __thiscall
BSTree<const_int_&,_int>::BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>::insert
          (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *this,int *key,int val)

{
  bool bVar1;
  unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  local_48;
  unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  local_40;
  unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
  local_38;
  pointer local_30;
  BSTreeNode *currentNode;
  int *piStack_20;
  int val_local;
  int *key_local;
  BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode> *this_local;
  
  currentNode._4_4_ = val;
  piStack_20 = key;
  key_local = (int *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    local_30 = std::
               unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
               ::get(&this->root);
    while (local_30 != (pointer)0x0) {
      if (*piStack_20 == *local_30->key) {
        return false;
      }
      if (*piStack_20 < *local_30->key) {
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30->left);
        if (!bVar1) {
          std::make_unique<BSTree<int_const&,int>::BSTreeNode,int_const&,int&>
                    ((int *)&local_38,piStack_20);
          std::
          unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ::operator=(&local_30->left,&local_38);
          std::
          unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ::~unique_ptr(&local_38);
          return true;
        }
        local_30 = std::
                   unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                   ::get(&local_30->left);
      }
      else if (*local_30->key < *piStack_20) {
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30->right);
        if (!bVar1) {
          std::make_unique<BSTree<int_const&,int>::BSTreeNode,int_const&,int&>
                    ((int *)&local_40,piStack_20);
          std::
          unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ::operator=(&local_30->right,&local_40);
          std::
          unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
          ::~unique_ptr(&local_40);
          return true;
        }
        local_30 = std::
                   unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
                   ::get(&local_30->right);
      }
    }
  }
  else {
    std::make_unique<BSTree<int_const&,int>::BSTreeNode,int_const&,int&>
              ((int *)&local_48,piStack_20);
    std::
    unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
    ::operator=(&this->root,&local_48);
    std::
    unique_ptr<BSTree<const_int_&,_int>::BSTreeNode,_std::default_delete<BSTree<const_int_&,_int>::BSTreeNode>_>
    ::~unique_ptr(&local_48);
  }
  return true;
}

Assistant:

bool insert(Key key, Val val){
      // if tree is not empty ...
      if (root){
        // we perform a traversal until we reach an empty subtree
        Node* currentNode = root.get();
        while (currentNode){
          // if key is present, no insertion is made
          if (key == currentNode->key){
            return false;
          }
          // otherwise we go down
          else{
            if (key < currentNode->key){
              // either we recursively insert into a nonempty subtree
              // ...
              if (currentNode->left){
                currentNode = currentNode->left.get();
              }
              // ... or we perform insertion in an empty subtree
              else{
                currentNode->left = std::make_unique<Node>(key, val);
                return true;
              }
            }
            // the same goes for right descent
            else if (key > currentNode->key){
              if (currentNode->right){
                currentNode = currentNode->right.get();
              }
              else{
                currentNode->right = std::make_unique<Node>(key, val);
                return true;
              }
            }
          }
        }
      }
      // if tree is empty, we insert at root
      else{
        root = std::make_unique<Node>(key, val);
        return true;
      }
      // this line should not be reached
      return true;
    }